

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::CheckerMemberVisitor::handle(CheckerMemberVisitor *this,MemberAccessExpression *expr)

{
  Type *this_00;
  bool bVar1;
  Symbol *symbol;
  Diagnostic *this_01;
  
  this_00 = (expr->value_->type).ptr;
  bVar1 = Type::isFixedSize(this_00);
  if (bVar1) {
    bVar1 = Type::isClass(this_00);
    if (!bVar1) goto LAB_00376da6;
  }
  bVar1 = Expression::bad(&expr->super_Expression);
  if (!bVar1) {
    symbol = Expression::getSymbolReference(expr->value_,true);
    if (symbol != (Symbol *)0x0) {
      bVar1 = isFromChecker(this,symbol);
      if (!bVar1) {
        this_01 = Scope::addDiag(&this->body->super_Scope,(DiagCode)0x4b0007,
                                 (expr->super_Expression).sourceRange);
        Diagnostic::addNote(this_01,(DiagCode)0x50001,symbol->location);
        return;
      }
    }
  }
LAB_00376da6:
  MemberAccessExpression::visitExprs<slang::ast::CheckerMemberVisitor&>(expr,this);
  return;
}

Assistant:

void handle(const MemberAccessExpression& expr) {
        auto& valueType = *expr.value().type;
        if ((!valueType.isFixedSize() || valueType.isClass()) && !expr.bad()) {
            if (auto sym = expr.value().getSymbolReference(); sym && !isFromChecker(*sym)) {
                auto& diag = body.addDiag(diag::DynamicFromChecker, expr.sourceRange);
                diag.addNote(diag::NoteDeclarationHere, sym->location);
                return;
            }
        }
        visitDefault(expr);
    }